

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# conversion.cpp
# Opt level: O1

void __thiscall
anon_unknown.dwarf_6597::FlexFloatConversionTest_LowersPrecision_Test::TestBody
          (FlexFloatConversionTest_LowersPrecision_Test *this)

{
  char *message;
  AssertionResult gtest_ar;
  double val;
  AssertHelper local_40;
  flexfloat_t local_38;
  internal local_28 [8];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_20;
  double local_18;
  
  local_18 = 1.000000000000001;
  local_38.value = 1.000000000000001;
  local_38.desc.exp_bits = '\b';
  local_38.desc.frac_bits = '\x17';
  flexfloat_sanitize(&local_38);
  local_40.data_ = (AssertHelperData *)local_38.value;
  testing::internal::CmpHelperNE<double,double>
            (local_28,"val","double(flexfloat<8, 23>(val))",&local_18,(double *)&local_40);
  if (local_28[0] == (internal)0x0) {
    testing::Message::Message((Message *)&local_38);
    if (local_20 == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      message = "";
    }
    else {
      message = (local_20->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_40,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/oprecomp[P]flexfloat/test/conversion.cpp"
               ,0x2a,message);
    testing::internal::AssertHelper::operator=(&local_40,(Message *)&local_38);
    testing::internal::AssertHelper::~AssertHelper(&local_40);
    if ((AssertHelperData *)local_38.value != (AssertHelperData *)0x0) {
      (**(code **)(*(long *)local_38.value + 8))();
    }
  }
  if (local_20 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&local_20,local_20);
  }
  return;
}

Assistant:

TEST(FlexFloatConversionTest, LowersPrecision) {
    const double val = 1.0 + 1e-15;
    EXPECT_NE(val, double(flexfloat<8, 23>(val)));  // round to float
}